

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

void pybind11::detail::clear_patients(PyObject *self)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  long lVar5;
  long *plVar6;
  internals *piVar7;
  ulong uVar8;
  PyObject **patient;
  undefined8 *puVar9;
  _Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
  __it;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  iterator __end2;
  
  piVar7 = get_internals();
  uVar1 = (piVar7->patients)._M_h._M_bucket_count;
  uVar8 = (ulong)self % uVar1;
  p_Var10 = (piVar7->patients)._M_h._M_buckets[uVar8];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var10 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var10->_M_nxt, p_Var11 = p_Var10, (PyObject *)p_Var10->_M_nxt[1]._M_nxt != self)) {
    while (p_Var10 = p_Var2, p_Var2 = p_Var10->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar8) ||
         (p_Var11 = p_Var10, (PyObject *)p_Var2[1]._M_nxt == self)) goto LAB_001c18c9;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_001c18c9:
  if (p_Var11 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var11->_M_nxt;
  }
  if (__it._M_cur == (__node_type *)0x0) {
    __assert_fail("pos != internals.patients.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/pybind11/include/pybind11/detail/class.h"
                  ,0x12e,"void pybind11::detail::clear_patients(PyObject *)");
  }
  puVar3 = *(undefined8 **)((long)__it._M_cur + 0x10);
  puVar4 = *(undefined8 **)((long)__it._M_cur + 0x18);
  lVar5 = *(long *)((long)__it._M_cur + 0x20);
  *(undefined8 *)((long)__it._M_cur + 0x10) = 0;
  *(undefined8 *)((long)__it._M_cur + 0x18) = 0;
  *(undefined8 *)((long)__it._M_cur + 0x20) = 0;
  std::
  _Hashtable<const__object_*,_std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const__object_*>,_std::hash<const__object_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&(piVar7->patients)._M_h,(const_iterator)__it._M_cur);
  *(byte *)&self[3].ob_refcnt = (byte)self[3].ob_refcnt & 0xef;
  for (puVar9 = puVar3; puVar9 != puVar4; puVar9 = puVar9 + 1) {
    plVar6 = (long *)*puVar9;
    if (plVar6 != (long *)0x0) {
      *puVar9 = 0;
      *plVar6 = *plVar6 + -1;
      if (*plVar6 == 0) {
        _Py_Dealloc();
      }
    }
  }
  if (puVar3 != (undefined8 *)0x0) {
    operator_delete(puVar3,lVar5 - (long)puVar3);
    return;
  }
  return;
}

Assistant:

inline void clear_patients(PyObject *self) {
    auto instance = reinterpret_cast<detail::instance *>(self);
    auto &internals = get_internals();
    auto pos = internals.patients.find(self);
    assert(pos != internals.patients.end());
    // Clearing the patients can cause more Python code to run, which
    // can invalidate the iterator. Extract the vector of patients
    // from the unordered_map first.
    auto patients = std::move(pos->second);
    internals.patients.erase(pos);
    instance->has_patients = false;
    for (PyObject *&patient : patients)
        Py_CLEAR(patient);
}